

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_compress.hpp
# Opt level: O0

void __thiscall
duckdb::AlpRDCompressionState<float>::AlpRDCompressionState
          (AlpRDCompressionState<float> *this,ColumnDataCheckpointData *checkpoint_data,
          AlpRDAnalyzeState<float> *analyze_state)

{
  CompressionFunction *pCVar1;
  long in_RDX;
  _func_int **in_RSI;
  CompressionState *in_RDI;
  idx_t in_stack_00000078;
  AlpRDCompressionState<float> *in_stack_00000080;
  unordered_map<unsigned_short,_unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
  *in_stack_ffffffffffffff98;
  unordered_map<unsigned_short,_unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
  *in_stack_ffffffffffffffa0;
  BufferHandle *this_00;
  CompressionInfo *pCVar2;
  ColumnDataCheckpointData *in_stack_ffffffffffffffd0;
  
  CompressionState::CompressionState(in_RDI,(CompressionInfo *)(in_RDX + 8));
  in_RDI->_vptr_CompressionState = (_func_int **)&PTR__AlpRDCompressionState_035105e8;
  in_RDI[1]._vptr_CompressionState = in_RSI;
  pCVar2 = &in_RDI[1].info;
  pCVar1 = ColumnDataCheckpointData::GetCompressionFunction
                     (in_stack_ffffffffffffffd0,(CompressionType)((ulong)pCVar2 >> 0x38));
  pCVar2->block_manager = (BlockManager *)pCVar1;
  this_00 = (BufferHandle *)(in_RDI + 2);
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::unique_ptr
            ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *)
             0xab27d6);
  BufferHandle::BufferHandle(this_00);
  in_RDI[4]._vptr_CompressionState = (_func_int **)0x0;
  in_RDI[4].info.block_manager = (BlockManager *)0x0;
  in_RDI[5]._vptr_CompressionState = (_func_int **)0x0;
  in_RDI[5].info.block_manager = (BlockManager *)0x0;
  alp::AlpRDCompressionState<float,_false>::AlpRDCompressionState
            ((AlpRDCompressionState<float,_false> *)0xab2821);
  ::std::
  unordered_map<unsigned_short,_unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
  ::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  *(undefined1 *)((long)&in_RDI[0x187].info.block_manager + 1) = *(undefined1 *)(in_RDX + 0x41);
  *(undefined1 *)&in_RDI[0x187].info.block_manager = *(undefined1 *)(in_RDX + 0x40);
  *(undefined1 *)&in_RDI[0x68d].info.block_manager = *(undefined1 *)(in_RDX + 0x50a0);
  *(uint *)&in_RDI[7]._vptr_CompressionState = (uint)*(byte *)&in_RDI[0x68d].info.block_manager * 2;
  *(int *)((long)&in_RDI[7]._vptr_CompressionState + 4) =
       *(int *)&in_RDI[7]._vptr_CompressionState + 7;
  memcpy((void *)((long)&in_RDI[0x587].info.block_manager + 4),(void *)(in_RDX + 0x4044),
         (ulong)*(uint *)&in_RDI[7]._vptr_CompressionState);
  ColumnDataCheckpointData::GetRowGroup((ColumnDataCheckpointData *)0xab28b1);
  CreateEmptySegment(in_stack_00000080,in_stack_00000078);
  return;
}

Assistant:

AlpRDCompressionState(ColumnDataCheckpointData &checkpoint_data, AlpRDAnalyzeState<T> *analyze_state)
	    : CompressionState(analyze_state->info), checkpoint_data(checkpoint_data),
	      function(checkpoint_data.GetCompressionFunction(CompressionType::COMPRESSION_ALPRD)) {
		//! State variables from the analyze step that are needed for compression
		state.left_parts_dict_map = std::move(analyze_state->state.left_parts_dict_map);
		state.left_bit_width = analyze_state->state.left_bit_width;
		state.right_bit_width = analyze_state->state.right_bit_width;
		state.actual_dictionary_size = analyze_state->state.actual_dictionary_size;
		actual_dictionary_size_bytes = state.actual_dictionary_size * AlpRDConstants::DICTIONARY_ELEMENT_SIZE;
		next_vector_byte_index_start = AlpRDConstants::HEADER_SIZE + actual_dictionary_size_bytes;
		memcpy((void *)state.left_parts_dict, (void *)analyze_state->state.left_parts_dict,
		       actual_dictionary_size_bytes);
		CreateEmptySegment(checkpoint_data.GetRowGroup().start);
	}